

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddNaryOp
          (InstructionBuilder *this,uint32_t type_id,Op opcode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,uint32_t result)

{
  initializer_list<unsigned_int> init_list;
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer this_00;
  IRContext *c;
  IRContext *this_01;
  Instruction *pIVar4;
  uint32_t local_ec;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_c0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  ulong local_48;
  size_t i;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  uint32_t result_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Op opcode_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = result;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(operands);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operands,local_48)
    ;
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = *pvVar3;
    init_list._M_len = 1;
    init_list._M_array =
         (iterator)
         ((long)&new_inst._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
    Operand::Operand(&local_78,SPV_OPERAND_TYPE_ID,&local_a0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i,
               &local_78);
    Operand::~Operand(&local_78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
    local_48 = local_48 + 1;
  }
  this_00 = (pointer)::operator_new(0x70);
  c = GetContext(this);
  if (ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    this_01 = GetContext(this);
    local_ec = IRContext::TakeNextId(this_01);
  }
  else {
    local_ec = ops.
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  opt::Instruction::Instruction(this_00,c,opcode,type_id,local_ec,(OperandList *)&i);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_c0,this_00);
  pIVar4 = AddInstruction(this,&local_c0);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_c0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
  return pIVar4;
}

Assistant:

Instruction* AddNaryOp(uint32_t type_id, spv::Op opcode,
                         const std::vector<uint32_t>& operands,
                         uint32_t result = 0) {
    std::vector<Operand> ops;
    for (size_t i = 0; i < operands.size(); i++) {
      ops.push_back({SPV_OPERAND_TYPE_ID, {operands[i]}});
    }
    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> new_inst(new Instruction(
        GetContext(), opcode, type_id,
        result != 0 ? result : GetContext()->TakeNextId(), ops));
    return AddInstruction(std::move(new_inst));
  }